

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep_coefficients.c
# Opt level: O1

SplittingStepCoefficients
SplittingStepCoefficients_LoadCoefficients(ARKODE_SplittingCoefficientsID method)

{
  sunrealtype **ppsVar1;
  sunrealtype *psVar2;
  SplittingStepCoefficients pSVar3;
  int order;
  
  switch(method) {
  case ARKODE_MIN_SPLITTING_NUM:
    pSVar3 = SplittingStepCoefficients_LieTrotter(2);
    return pSVar3;
  case ARKODE_SPLITTING_STRANG_2_2_2:
    order = 2;
    break;
  case ARKODE_SPLITTING_BEST_2_2_2:
    pSVar3 = SplittingStepCoefficients_Alloc(1,2,2);
    pSVar3->order = 2;
    *pSVar3->alpha = 1.0;
    ppsVar1 = *pSVar3->beta;
    psVar2 = ppsVar1[1];
    *psVar2 = 0.2928932188134524;
    psVar2[1] = 0.7071067811865476;
    psVar2 = ppsVar1[2];
    goto LAB_0015ebdb;
  case ARKODE_SPLITTING_SUZUKI_3_3_2:
    pSVar3 = SplittingStepCoefficients_ThirdOrderSuzuki(2);
    return pSVar3;
  case ARKODE_SPLITTING_RUTH_3_3_2:
    pSVar3 = SplittingStepCoefficients_Alloc(1,3,2);
    pSVar3->order = 3;
    *pSVar3->alpha = 1.0;
    ppsVar1 = *pSVar3->beta;
    psVar2 = ppsVar1[1];
    *psVar2 = 1.0;
    psVar2[1] = -0.041666666666666664;
    psVar2 = ppsVar1[2];
    *psVar2 = 0.3333333333333333;
    psVar2[1] = 0.7083333333333334;
    psVar2 = ppsVar1[3];
LAB_0015ebdb:
    *psVar2 = 1.0;
    psVar2[1] = 1.0;
    return pSVar3;
  case ARKODE_SPLITTING_YOSHIDA_4_4_2:
    order = 4;
    break;
  case ARKODE_MAX_SPLITTING_NUM:
    order = 6;
    break;
  case ARKODE_SPLITTING_NONE:
    return (SplittingStepCoefficients)0x0;
  default:
    arkProcessError((ARKodeMem)0x0,-0x16,0xb7,"SplittingStepCoefficients_LoadCoefficients",
                    "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep_coefficients.c"
                    ,"Unknown splitting coefficients");
    return (SplittingStepCoefficients)0x0;
  }
  pSVar3 = SplittingStepCoefficients_ComposeStrang(2,order,3);
  return pSVar3;
}

Assistant:

SplittingStepCoefficients SplittingStepCoefficients_LoadCoefficients(
  const ARKODE_SplittingCoefficientsID method)
{
  switch (method)
  {
#define ARK_SPLITTING_COEFFICIENTS(name, coeff) \
  case name: coeff break;
#include "arkode_splittingstep_coefficients.def"
#undef ARK_SPLITTING_COEFFICIENTS

  default:
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    "Unknown splitting coefficients");
    return NULL;
  }
}